

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_bbdpre.c
# Opt level: O3

int IDABBDPrecSetup(sunrealtype tt,N_Vector yy,N_Vector yp,N_Vector rr,sunrealtype c_j,
                   void *bbd_data)

{
  double dVar1;
  IDAMem IDA_mem;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  sunrealtype *psVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long j;
  bool bVar27;
  ulong uVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  long local_a8;
  long local_a0;
  
  IDA_mem = *(IDAMem *)((long)bbd_data + 0x98);
  SUNMatZero(*(undefined8 *)((long)bbd_data + 0x40));
  uVar2 = *(undefined8 *)((long)bbd_data + 0x60);
  uVar3 = *(undefined8 *)((long)bbd_data + 0x68);
  uVar4 = *(undefined8 *)((long)bbd_data + 0x70);
  uVar5 = *(undefined8 *)((long)bbd_data + 0x78);
  lVar6 = *(long *)((long)bbd_data + 0x98);
  N_VScale(0x3ff0000000000000,yy);
  N_VScale(0x3ff0000000000000,yp,uVar4);
  lVar10 = N_VGetArrayPointer(yy);
  lVar11 = N_VGetArrayPointer(yp);
  lVar12 = N_VGetArrayPointer(uVar5);
  lVar13 = N_VGetArrayPointer(*(undefined8 *)(lVar6 + 0x180));
  if (*(int *)(lVar6 + 0x58) == 0) {
    local_a8 = 0;
  }
  else {
    local_a8 = N_VGetArrayPointer(*(undefined8 *)(lVar6 + 0x1b8));
  }
  lVar14 = N_VGetArrayPointer(uVar3);
  lVar15 = N_VGetArrayPointer(uVar4);
  lVar16 = N_VGetArrayPointer(uVar2);
  if ((*(code **)((long)bbd_data + 0x30) == (code *)0x0) ||
     (iVar9 = (**(code **)((long)bbd_data + 0x30))
                        (tt,*(undefined8 *)((long)bbd_data + 0x38),yy,yp,
                         *(undefined8 *)(lVar6 + 0x18)), iVar9 == 0)) {
    iVar9 = (**(code **)((long)bbd_data + 0x28))
                      (tt,*(undefined8 *)((long)bbd_data + 0x38),yy,yp,uVar2,
                       *(undefined8 *)(lVar6 + 0x18));
    *(long *)((long)bbd_data + 0x90) = *(long *)((long)bbd_data + 0x90) + 1;
    if (iVar9 == 0) {
      lVar7 = *bbd_data;
      lVar8 = *(long *)((long)bbd_data + 8);
      lVar21 = lVar8 + lVar7 + 1;
      lVar26 = *(long *)((long)bbd_data + 0x38);
      lVar24 = lVar26;
      if (lVar21 < lVar26) {
        lVar24 = lVar21;
      }
      if (0 < lVar24) {
        local_a0 = 0;
        lVar17 = 1;
        do {
          j = lVar17 + -1;
          if (lVar17 <= lVar26) {
            iVar9 = *(int *)(lVar6 + 0x58);
            lVar19 = j;
            do {
              dVar1 = *(double *)(lVar10 + lVar19 * 8);
              dVar29 = *(double *)(lVar11 + lVar19 * 8) * *(double *)(lVar6 + 0x290);
              dVar30 = ABS(dVar29);
              dVar31 = 1.0 / *(double *)(lVar13 + lVar19 * 8);
              if (dVar30 <= dVar31) {
                dVar30 = dVar31;
              }
              dVar31 = ABS(dVar1);
              if (ABS(dVar1) <= dVar30) {
                dVar31 = dVar30;
              }
              dVar31 = dVar31 * *(double *)((long)bbd_data + 0x20);
              uVar28 = -(ulong)(dVar29 < 0.0);
              dVar30 = ((double)((ulong)-dVar31 & uVar28 | ~uVar28 & (ulong)dVar31) + dVar1) - dVar1
              ;
              if (iVar9 != 0) {
                dVar29 = *(double *)(local_a8 + lVar19 * 8);
                dVar31 = ABS(dVar29);
                if ((dVar31 != 1.0) || (NAN(dVar31))) {
                  if ((dVar31 == 2.0) && ((!NAN(dVar31) && ((dVar1 + dVar30) * dVar29 <= 0.0))))
                  goto LAB_0010f359;
                }
                else if ((dVar1 + dVar30) * dVar29 < 0.0) {
LAB_0010f359:
                  dVar30 = -dVar30;
                }
              }
              *(double *)(lVar14 + lVar19 * 8) = dVar30 + *(double *)(lVar14 + lVar19 * 8);
              *(double *)(lVar15 + lVar19 * 8) = c_j * dVar30 + *(double *)(lVar15 + lVar19 * 8);
              lVar19 = lVar19 + lVar21;
            } while (lVar19 < lVar26);
          }
          iVar9 = (**(code **)((long)bbd_data + 0x28))
                            (tt,lVar26,uVar3,uVar4,uVar5,*(undefined8 *)(lVar6 + 0x18));
          *(long *)((long)bbd_data + 0x90) = *(long *)((long)bbd_data + 0x90) + 1;
          if (iVar9 != 0) goto LAB_0010f1c0;
          lVar26 = *(long *)((long)bbd_data + 0x38);
          lVar19 = local_a0;
          if (lVar17 <= lVar26) {
            do {
              dVar1 = *(double *)(lVar10 + j * 8);
              *(double *)(lVar14 + j * 8) = dVar1;
              dVar30 = *(double *)(lVar11 + j * 8);
              *(double *)(lVar15 + j * 8) = dVar30;
              dVar30 = dVar30 * *(double *)(lVar6 + 0x290);
              dVar29 = ABS(dVar30);
              dVar31 = 1.0 / *(double *)(lVar13 + j * 8);
              if (dVar29 <= dVar31) {
                dVar29 = dVar31;
              }
              dVar31 = ABS(dVar1);
              if (ABS(dVar1) <= dVar29) {
                dVar31 = dVar29;
              }
              dVar31 = dVar31 * *(double *)((long)bbd_data + 0x20);
              uVar28 = -(ulong)(dVar30 < 0.0);
              dVar30 = ((double)((ulong)-dVar31 & uVar28 | ~uVar28 & (ulong)dVar31) + dVar1) - dVar1
              ;
              if (*(int *)(lVar6 + 0x58) != 0) {
                dVar29 = *(double *)(local_a8 + j * 8);
                dVar31 = ABS(dVar29);
                if ((dVar31 != 1.0) || (NAN(dVar31))) {
                  if ((dVar31 == 2.0) && ((!NAN(dVar31) && ((dVar1 + dVar30) * dVar29 <= 0.0))))
                  goto LAB_0010f4c8;
                }
                else if ((dVar1 + dVar30) * dVar29 < 0.0) {
LAB_0010f4c8:
                  dVar30 = -dVar30;
                }
              }
              psVar18 = SUNBandMatrix_Column(*(SUNMatrix *)((long)bbd_data + 0x40),j);
              lVar20 = j - *(long *)((long)bbd_data + 0x10);
              lVar25 = 0;
              if (0 < lVar20) {
                lVar25 = lVar20;
              }
              lVar26 = *(long *)((long)bbd_data + 0x38);
              lVar22 = *(long *)((long)bbd_data + 0x18) + j;
              if (lVar26 + -1 <= lVar22) {
                lVar22 = lVar26 + -1;
              }
              if (lVar25 <= lVar22) {
                if (lVar20 < 1) {
                  lVar20 = 0;
                }
                lVar20 = lVar20 + -1;
                do {
                  *(double *)((long)psVar18 + lVar20 * 8 + lVar19 + 8) =
                       (*(double *)(lVar12 + 8 + lVar20 * 8) - *(double *)(lVar16 + 8 + lVar20 * 8))
                       * (1.0 / dVar30);
                  lVar20 = lVar20 + 1;
                } while (lVar20 < lVar22);
              }
              j = j + lVar21;
              lVar19 = lVar19 + ~(lVar8 + lVar7) * 8;
            } while (j < lVar26);
          }
          local_a0 = local_a0 + -8;
          bVar27 = lVar17 != lVar24;
          lVar17 = lVar17 + 1;
        } while (bVar27);
      }
      iVar9 = SUNLinSolSetup_Band(*(SUNLinearSolver *)((long)bbd_data + 0x48),
                                  *(SUNMatrix *)((long)bbd_data + 0x40));
      return iVar9;
    }
  }
LAB_0010f1c0:
  iVar23 = 1;
  if (iVar9 < 0) {
    iVar23 = -1;
    IDAProcessError(IDA_mem,-1,0x1db,"IDABBDPrecSetup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_bbdpre.c"
                    ,"The Glocal or Gcomm routine failed in an unrecoverable manner.");
  }
  return iVar23;
}

Assistant:

static int IDABBDPrecSetup(sunrealtype tt, N_Vector yy, N_Vector yp,
                           SUNDIALS_MAYBE_UNUSED N_Vector rr, sunrealtype c_j,
                           void* bbd_data)
{
  IBBDPrecData pdata;
  IDAMem IDA_mem;
  int retval;

  pdata = (IBBDPrecData)bbd_data;

  IDA_mem = (IDAMem)pdata->ida_mem;

  /* Call IBBDDQJac for a new Jacobian calculation and store in PP. */
  retval = SUNMatZero(pdata->PP);
  retval = IBBDDQJac(pdata, tt, c_j, yy, yp, pdata->tempv1, pdata->tempv2,
                     pdata->tempv3, pdata->tempv4);
  if (retval < 0)
  {
    IDAProcessError(IDA_mem, -1, __LINE__, __func__, __FILE__,
                    MSGBBD_FUNC_FAILED);
    return (-1);
  }
  if (retval > 0) { return (1); }

  /* Do LU factorization of matrix and return error flag */
  retval = SUNLinSolSetup_Band(pdata->LS, pdata->PP);
  return (retval);
}